

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

aiQuaternion __thiscall Assimp::B3DImporter::ReadQuat(B3DImporter *this)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  aiQuaternion aVar6;
  
  fVar2 = ReadFloat(this);
  fVar3 = ReadFloat(this);
  fVar4 = ReadFloat(this);
  fVar5 = ReadFloat(this);
  aVar6.z = fVar5;
  aVar6.y = fVar4;
  uVar1 = CONCAT44(fVar3,fVar2) ^ 0x80000000;
  aVar6.w = (float)(int)uVar1;
  aVar6.x = (float)(int)(uVar1 >> 0x20);
  return aVar6;
}

Assistant:

aiQuaternion B3DImporter::ReadQuat(){
    // (aramis_acg) Fix to adapt the loader to changed quat orientation
    float w=-ReadFloat();
    float x=ReadFloat();
    float y=ReadFloat();
    float z=ReadFloat();
    return aiQuaternion( w,x,y,z );
}